

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_remove_route(ndn_face_intf_t *face,uint8_t *prefix,size_t length)

{
  ndn_fib_entry_t *entry;
  ndn_bitset_t nVar1;
  ndn_fib_entry_t *fib_entry;
  int ret;
  size_t length_local;
  uint8_t *prefix_local;
  ndn_face_intf_t *face_local;
  
  if (face == (ndn_face_intf_t *)0x0) {
    face_local._4_4_ = -0x10;
  }
  else if (face->face_id < (forwarder.facetab)->capacity) {
    face_local._4_4_ = tlv_check_type_length(prefix,length,7);
    if (face_local._4_4_ == 0) {
      entry = ndn_fib_find(forwarder.fib,prefix,length);
      if (entry == (ndn_fib_entry_t *)0x0) {
        face_local._4_4_ = -0x32;
      }
      else {
        nVar1 = bitset_unset(entry->nexthop,(ulong)face->face_id);
        entry->nexthop = nVar1;
        ndn_fib_remove_entry_if_empty(forwarder.fib,entry);
        face_local._4_4_ = 0;
      }
    }
  }
  else {
    face_local._4_4_ = -0x36;
  }
  return face_local._4_4_;
}

Assistant:

int
ndn_forwarder_remove_route(ndn_face_intf_t* face, uint8_t* prefix, size_t length)
{
  int ret;

  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id >= forwarder.facetab->capacity)
    return NDN_FWD_INVALID_FACE;
  ret = tlv_check_type_length(prefix, length, TLV_Name);
  if(ret != NDN_SUCCESS)
    return ret;

  ndn_fib_entry_t* fib_entry = ndn_fib_find(forwarder.fib, prefix, length);
  if (fib_entry == NULL)
    return NDN_FWD_NO_EFFECT;
  fib_entry->nexthop = bitset_unset(fib_entry->nexthop, face->face_id);
  ndn_fib_remove_entry_if_empty(forwarder.fib, fib_entry);
  return NDN_SUCCESS;
}